

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::adc_a_mhl(CPU *this)

{
  byte bVar1;
  Registers *r1;
  int iVar2;
  ushort uVar3;
  uint16_t addr;
  CPU *this_local;
  
  bVar1 = this->regs->l;
  uVar3 = (ushort)this->regs->h * 0x100 + (ushort)bVar1;
  r1 = this->regs;
  iVar2 = (**this->mmu->_vptr_IMmu)
                    (this->mmu,(ulong)uVar3,(ulong)bVar1,CONCAT62((int6)((ulong)r1 >> 0x10),uVar3));
  adc_r8_r8(this,&r1->a,(uint8_t)iVar2);
  return 2;
}

Assistant:

int CPU::adc_a_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    adc_r8_r8(regs.a, mmu.read_byte(addr));
    return 2;
}